

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O2

int __thiscall ncnn::Convolution_x86::create_pipeline_int8_x86(Convolution_x86 *this,Option *opt)

{
  float fVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined4 uVar8;
  undefined4 uVar13;
  float *pfVar9;
  void *pvVar10;
  int *piVar11;
  Allocator *pAVar12;
  int max_ii;
  bool bVar14;
  int k_5;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 *puVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  long lVar28;
  short *psVar29;
  void *pvVar30;
  uint uVar31;
  long lVar32;
  int k_1;
  int iVar33;
  int i_00;
  ulong uVar34;
  long lVar35;
  int i;
  int iVar36;
  size_t _elemsize;
  long lVar37;
  long lVar38;
  int max_kk;
  char *pcVar39;
  short *psVar40;
  undefined1 *puVar41;
  int m_1;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  int k;
  int k_00;
  int k_3;
  ulong uVar46;
  long lVar47;
  uint _h;
  long lVar48;
  undefined1 auVar49 [16];
  float fVar50;
  long local_1e8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b8;
  int TILE_N;
  ulong local_1a8;
  Option *local_1a0;
  ulong local_198;
  short *local_190;
  uint local_184;
  Mat m;
  long local_138;
  Mat local_128;
  ulong local_e0;
  Mat *local_d8;
  int TILE_M;
  long local_c8;
  undefined8 local_c0;
  int TILE_M_2;
  short asStack_b4 [2];
  undefined8 local_b0;
  undefined8 local_a8;
  int local_a0;
  short sStack_9a;
  Allocator *local_98;
  int local_90;
  int local_8c;
  int local_88;
  undefined8 local_84;
  size_t local_78;
  long local_68;
  long local_60;
  ulong local_58;
  ulong local_50;
  int TILE_K;
  long local_40;
  ulong local_38;
  
  uVar8 = (this->super_Convolution).kernel_w;
  uVar13 = (this->super_Convolution).kernel_h;
  uVar21 = uVar13 * uVar8;
  uVar46 = (long)(this->super_Convolution).weight_data_size / (long)(int)uVar21;
  uVar23 = (this->super_Convolution).num_output;
  uVar24 = (ulong)(int)uVar23;
  uVar46 = (long)((ulong)(uint)((int)uVar46 >> 0x1f) << 0x20 | uVar46 & 0xffffffff) /
           (long)(int)uVar23;
  uVar25 = uVar46 & 0xffffffff;
  _h = (uint)uVar46;
  if ((opt->use_winograd23_convolution == false) && (opt->use_winograd43_convolution != true)) {
    bVar14 = false;
    uVar27 = uVar23;
  }
  else {
    bVar14 = 8 < (int)uVar23 || 8 < (int)_h;
    uVar27 = (uint)CONCAT71((int7)(int3)(uVar23 >> 8),8 < (int)_h);
  }
  auVar49._0_4_ = -(uint)(uVar8 == 3);
  auVar49._4_4_ = -(uint)(uVar13 == 3);
  auVar49._8_4_ = -(uint)((this->super_Convolution).dilation_w == 1);
  auVar49._12_4_ = -(uint)((this->super_Convolution).dilation_h == 1);
  iVar22 = movmskps(uVar27,auVar49);
  local_d8 = &(this->super_Convolution).weight_data;
  lVar28 = (long)(int)_h;
  local_1a0 = opt;
  if ((((iVar22 == 0xf) && ((this->super_Convolution).stride_w == 1)) &&
      ((this->super_Convolution).stride_h == 1)) &&
     ((opt->use_winograd_convolution != false && (bVar14)))) {
    if (opt->use_winograd43_convolution == true) {
      get_optimal_tile_mnk_int8(uVar23,0,_h,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      local_198 = (ulong)(uint)TILE_M;
      uVar46 = (long)(int)((uVar23 - 1) + TILE_M) / (long)TILE_M;
      local_128.cstep = 0;
      local_128.data = (void *)0x0;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = 0;
      local_128.elemsize._4_4_ = 0;
      local_128.elempack = 0;
      local_128.allocator = (Allocator *)0x0;
      local_128.dims = 0;
      local_128.w = 0;
      local_128.h = 0;
      local_128.d = 0;
      local_128.c = 0;
      Mat::create(&local_128,TILE_K * TILE_M * 0x24,1,opt->num_threads,4,(Allocator *)0x0);
      iVar22 = (int)uVar46;
      Mat::create(&this->weight_winograd43_data,TILE_K * TILE_M,0x24,
                  (int)(_h + TILE_K + -1) / TILE_K,iVar22,4,(Allocator *)0x0);
      uVar46 = uVar46 & 0xffffffff;
      if (iVar22 < 1) {
        uVar46 = 0;
      }
      for (uVar24 = 0; opt = local_1a0, uVar24 != uVar46; uVar24 = uVar24 + 1) {
        iVar22 = get_omp_thread_num();
        m.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        local_190 = (short *)((long)iVar22 * local_128.cstep * m.elemsize + (long)local_128.data);
        m.refcount = (int *)0x0;
        m.elempack = local_128.elempack;
        m.allocator = local_128.allocator;
        m.w = local_128.w;
        m.d = 1;
        m.h = local_128.h;
        m.c = local_128.d;
        m.dims = local_128.dims + -1;
        m.cstep = (m.elemsize * (long)local_128.h * (long)local_128.w + 0xf & 0xfffffffffffffff0) /
                  m.elemsize;
        if (local_128.dims == 4) {
          m.cstep = (long)local_128.h * (long)local_128.w;
        }
        iVar22 = (int)uVar24 * (int)local_198;
        uVar21 = uVar23 - iVar22;
        uVar25 = (ulong)uVar21;
        if ((int)local_198 < (int)uVar21) {
          uVar25 = local_198 & 0xffffffff;
        }
        local_1a8 = CONCAT44(local_1a8._4_4_,(int)uVar25);
        uVar18 = 0;
        if (0 < (int)uVar25) {
          uVar18 = uVar25;
        }
        m.data = local_190;
        for (uVar25 = 0; (long)uVar25 < lVar28; uVar25 = uVar25 + (long)TILE_K) {
          uVar21 = _h - (int)uVar25;
          if (TILE_K < (int)uVar21) {
            uVar21 = TILE_K;
          }
          uVar17 = 0;
          if (0 < (int)uVar21) {
            uVar17 = (ulong)uVar21;
          }
          psVar40 = local_190;
          for (uVar26 = 0; uVar26 != uVar18; uVar26 = uVar26 + 1) {
            pvVar30 = local_d8->data;
            for (uVar34 = 0; uVar34 != uVar17; uVar34 = uVar34 + 1) {
              pcVar39 = (char *)((long)pvVar30 +
                                (uVar34 + uVar25) * 9 + (long)(int)((iVar22 + (int)uVar26) * _h * 9)
                                );
              for (lVar42 = 0; lVar42 != 3; lVar42 = lVar42 + 1) {
                cVar2 = *pcVar39;
                cVar3 = pcVar39[1];
                cVar4 = pcVar39[2];
                asStack_b4[lVar42 + -2] = cVar2 * 6;
                asStack_b4[lVar42 + 1] = -(cVar4 * 4 + cVar3 * 4 + cVar2 * 4);
                *(short *)((long)&local_b0 + lVar42 * 2 + 4) = cVar3 * 4 + cVar2 * -4 + cVar4 * -4;
                *(short *)((long)&local_a8 + lVar42 * 2 + 2) = (short)cVar2 + cVar3 * 2 + cVar4 * 4;
                *(short *)((long)&local_a0 + lVar42 * 2) =
                     ((short)cVar2 - ((short)cVar3 + (short)cVar3)) + cVar4 * 4;
                (&sStack_9a)[lVar42] = cVar4 * 6;
                pcVar39 = pcVar39 + 3;
              }
              for (lVar42 = 0; lVar42 != 0x24; lVar42 = lVar42 + 6) {
                sVar5 = *(short *)((long)asStack_b4 + lVar42 + -4);
                sVar6 = *(short *)((long)asStack_b4 + lVar42 + -2);
                sVar7 = *(short *)((long)asStack_b4 + lVar42);
                *psVar40 = sVar5 * 6;
                psVar40[1] = -(sVar7 * 4 + sVar6 * 4 + sVar5 * 4);
                psVar40[2] = sVar6 * 4 + sVar5 * -4 + sVar7 * -4;
                psVar40[3] = sVar5 + sVar6 * 2 + sVar7 * 4;
                psVar40[4] = sVar5 + sVar6 * -2 + sVar7 * 4;
                psVar40[5] = sVar7 * 6;
                psVar40 = psVar40 + 6;
              }
            }
          }
          local_8c = (this->weight_winograd43_data).w;
          local_88 = (this->weight_winograd43_data).h;
          local_a8 = (this->weight_winograd43_data).elemsize;
          local_a0 = (this->weight_winograd43_data).elempack;
          local_98 = (this->weight_winograd43_data).allocator;
          local_78 = (long)local_88 * (long)local_8c;
          _TILE_M_2 = (void *)((long)(this->weight_winograd43_data).data +
                              local_a8 * local_78 *
                              (long)(int)((long)((ulong)(uint)((int)uVar25 >> 0x1f) << 0x20 |
                                                uVar25 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd43_data).cstep * uVar24 * local_a8);
          local_b0 = (int *)0x0;
          local_90 = 2;
          local_84._0_4_ = 1;
          local_84._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x24,(int)local_1a8,uVar21);
        }
      }
      piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar11 == (int *)0x0) goto LAB_0014ed75;
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) goto LAB_0014ed75;
      if (local_128.allocator != (Allocator *)0x0) {
        (*(local_128.allocator)->_vptr_Allocator[3])();
        goto LAB_0014ed75;
      }
    }
    else {
      get_optimal_tile_mnk_int8(uVar23,0,_h,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
      local_1a8 = (ulong)(uint)TILE_M;
      uVar46 = (long)(int)((uVar23 - 1) + TILE_M) / (long)TILE_M;
      local_128.cstep = 0;
      local_128.data = (void *)0x0;
      local_128.refcount._0_4_ = 0;
      local_128.refcount._4_4_ = 0;
      local_128.elemsize._0_4_ = 0;
      local_128.elemsize._4_4_ = 0;
      local_128.elempack = 0;
      local_128.allocator = (Allocator *)0x0;
      local_128.dims = 0;
      local_128.w = 0;
      local_128.h = 0;
      local_128.d = 0;
      local_128.c = 0;
      Mat::create(&local_128,TILE_K * TILE_M * 0x10,1,opt->num_threads,2,(Allocator *)0x0);
      iVar22 = (int)uVar46;
      Mat::create(&this->weight_winograd23_data,TILE_K * TILE_M,0x10,
                  (int)(_h + TILE_K + -1) / TILE_K,iVar22,2,(Allocator *)0x0);
      local_198 = uVar46 & 0xffffffff;
      if (iVar22 < 1) {
        local_198 = 0;
      }
      opt = local_1a0;
      for (uVar46 = 0; uVar46 != local_198; uVar46 = uVar46 + 1) {
        iVar22 = get_omp_thread_num();
        m.elemsize = CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
        psVar40 = (short *)((long)iVar22 * local_128.cstep * m.elemsize + (long)local_128.data);
        m.refcount = (int *)0x0;
        m.elempack = local_128.elempack;
        m.allocator = local_128.allocator;
        m.w = local_128.w;
        m.d = 1;
        m.h = local_128.h;
        m.c = local_128.d;
        m.dims = local_128.dims + -1;
        m.cstep = (m.elemsize * (long)local_128.h * (long)local_128.w + 0xf & 0xfffffffffffffff0) /
                  m.elemsize;
        if (local_128.dims == 4) {
          m.cstep = (long)local_128.h * (long)local_128.w;
        }
        iVar22 = (int)uVar46 * (int)local_1a8;
        uVar21 = uVar23 - iVar22;
        uVar24 = (ulong)uVar21;
        if ((int)local_1a8 < (int)uVar21) {
          uVar24 = local_1a8 & 0xffffffff;
        }
        local_190 = (short *)CONCAT44(local_190._4_4_,(int)uVar24);
        uVar25 = 0;
        if (0 < (int)uVar24) {
          uVar25 = uVar24;
        }
        m.data = psVar40;
        for (uVar24 = 0; (long)uVar24 < lVar28; uVar24 = uVar24 + (long)TILE_K) {
          uVar21 = _h - (int)uVar24;
          if (TILE_K < (int)uVar21) {
            uVar21 = TILE_K;
          }
          uVar18 = 0;
          if (0 < (int)uVar21) {
            uVar18 = (ulong)uVar21;
          }
          psVar29 = psVar40;
          for (uVar17 = 0; uVar17 != uVar25; uVar17 = uVar17 + 1) {
            pvVar30 = local_d8->data;
            for (uVar26 = 0; uVar26 != uVar18; uVar26 = uVar26 + 1) {
              pcVar39 = (char *)((long)pvVar30 +
                                (uVar26 + uVar24) * 9 + (long)(int)((iVar22 + (int)uVar17) * _h * 9)
                                );
              for (lVar42 = 0; lVar20 = 4, lVar42 != 3; lVar42 = lVar42 + 1) {
                cVar2 = *pcVar39;
                cVar3 = pcVar39[1];
                cVar4 = pcVar39[2];
                asStack_b4[lVar42 + -2] = cVar2 * 2;
                asStack_b4[lVar42 + 1] = (short)cVar3 + (short)cVar2 + (short)cVar4;
                *(short *)((long)&local_b0 + lVar42 * 2 + 4) =
                     ((short)cVar2 - (short)cVar3) + (short)cVar4;
                *(short *)((long)&local_a8 + lVar42 * 2 + 2) = (short)cVar4 + (short)cVar4;
                pcVar39 = pcVar39 + 3;
              }
              for (; lVar20 != 0x1c; lVar20 = lVar20 + 6) {
                sVar5 = *(short *)((long)&local_c0 + lVar20 + 4);
                sVar6 = *(short *)((long)&local_c0 + lVar20 + 6);
                sVar7 = *(short *)((long)asStack_b4 + lVar20 + -4);
                *psVar29 = sVar5 * 2;
                psVar29[1] = sVar6 + sVar5 + sVar7;
                psVar29[2] = (sVar5 - sVar6) + sVar7;
                psVar29[3] = sVar7 * 2;
                psVar29 = psVar29 + 4;
              }
              opt = local_1a0;
            }
          }
          local_8c = (this->weight_winograd23_data).w;
          local_88 = (this->weight_winograd23_data).h;
          local_a8 = (this->weight_winograd23_data).elemsize;
          local_a0 = (this->weight_winograd23_data).elempack;
          local_98 = (this->weight_winograd23_data).allocator;
          local_78 = (long)local_88 * (long)local_8c;
          _TILE_M_2 = (void *)((long)(this->weight_winograd23_data).data +
                              local_a8 * local_78 *
                              (long)(int)((long)((ulong)(uint)((int)uVar24 >> 0x1f) << 0x20 |
                                                uVar24 & 0xffffffff) / (long)TILE_K) +
                              (this->weight_winograd23_data).cstep * uVar46 * local_a8);
          local_b0 = (int *)0x0;
          local_90 = 2;
          local_84._0_4_ = 1;
          local_84._4_4_ = 1;
          pack_A_tile_int8(&m,(Mat *)&TILE_M_2,0x10,(int)local_190,uVar21);
        }
      }
      piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar11 == (int *)0x0) goto LAB_0014ed75;
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 != 0) goto LAB_0014ed75;
      if (local_128.allocator != (Allocator *)0x0) {
        (*(local_128.allocator)->_vptr_Allocator[3])();
        goto LAB_0014ed75;
      }
    }
  }
  else {
    if (opt->use_sgemm_convolution != true) {
      uVar27 = _h;
      if ((int)uVar23 < 4) {
        if ((int)uVar23 < 2) {
          if ((int)_h < 8) {
            if ((int)_h < 2) {
              _elemsize = 1;
              iVar22 = 1;
            }
            else {
              _elemsize = 2;
              iVar22 = 2;
              uVar27 = _h - (int)(uVar25 >> 1);
            }
          }
          else {
            _elemsize = 8;
            iVar22 = 8;
            uVar27 = (_h & 1) + (int)(uVar25 >> 3) + ((uint)(uVar25 >> 1) & 3);
          }
        }
        else if ((int)_h < 8) {
          if ((int)_h < 2) {
            uVar23 = (uVar23 & 1) + 1;
            _elemsize = 2;
            iVar22 = 2;
          }
          else {
            uVar27 = _h - ((uint)(uVar46 >> 1) & 0x7fffffff);
            uVar23 = (uVar23 & 1) + 1;
            _elemsize = 4;
            iVar22 = 4;
          }
        }
        else {
          uVar27 = (_h & 1) + ((uint)(uVar46 >> 3) & 0x1fffffff) + ((uint)(uVar46 >> 1) & 3);
          uVar23 = (uVar23 & 1) + 1;
          _elemsize = 0x10;
          iVar22 = 0x10;
        }
      }
      else if ((int)_h < 8) {
        if ((int)_h < 2) {
          uVar23 = (uVar23 & 1) + ((uint)(uVar24 >> 2) & 0x3fffffff) +
                   (uint)((uVar23 >> 1 & 1) != 0);
          _elemsize = 4;
          iVar22 = 4;
        }
        else {
          uVar27 = _h - ((uint)(uVar46 >> 1) & 0x7fffffff);
          uVar23 = (uVar23 & 1) + ((uint)(uVar24 >> 2) & 0x3fffffff) +
                   (uint)((uVar23 >> 1 & 1) != 0);
          _elemsize = 8;
          iVar22 = 8;
        }
      }
      else {
        uVar27 = (_h & 1) + (int)(uVar25 >> 3) + ((uint)(uVar46 >> 1) & 3);
        uVar23 = (uVar23 & 1) + ((uint)(uVar24 >> 2) & 0x3fffffff) + (uint)((uVar23 >> 1 & 1) != 0);
        _elemsize = 0x20;
        iVar22 = 0x20;
      }
      Mat::create(&this->weight_data_tm,uVar21,uVar27,uVar23,_elemsize,iVar22,(Allocator *)0x0);
      uVar23 = _h * uVar21;
      local_58 = (ulong)uVar23;
      local_40 = (long)(int)uVar21;
      lVar28 = (long)(int)(uVar21 * 2);
      local_190 = (short *)(long)(int)(uVar21 * 8);
      local_e0 = 0;
      uVar46 = 0;
      if (0 < (int)uVar21) {
        uVar46 = (ulong)uVar21;
      }
      uVar15 = uVar23 * 4;
      local_38 = (ulong)uVar15;
      iVar22 = uVar23 * 3;
      iVar33 = uVar23 * 2;
      uVar25 = 0;
      uVar27 = uVar23;
      while (uVar31 = uVar27, uVar18 = uVar25, (long)(uVar18 | 3) < (long)uVar24) {
        local_68 = (long)iVar22;
        iVar36 = (int)local_e0;
        pvVar30 = (this->super_Convolution).weight_data.data;
        uVar27 = (uint)uVar18;
        local_138 = (long)(int)(uVar23 * uVar27) + (long)pvVar30;
        local_c0 = (long)(int)((uVar27 | 1) * uVar23) + (long)pvVar30;
        local_c8 = (long)(int)((uVar27 | 2) * uVar23) + (long)pvVar30;
        local_1e8 = (long)(int)((int)(uVar18 | 3) * uVar23) + (long)pvVar30;
        lVar42 = (long)pvVar30 + local_68 + local_40;
        lVar20 = (long)pvVar30 + iVar33 + local_40;
        lVar32 = (long)pvVar30 + (int)uVar31 + local_40;
        lVar44 = (long)pvVar30 + iVar36 + local_40;
        puVar41 = (undefined1 *)
                  ((uVar18 >> 2) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
        lVar38 = 0;
        local_1d0 = lVar20;
        local_1c8 = lVar42;
        local_1c0 = lVar32;
        local_1b8 = lVar44;
        for (uVar27 = 0; (int)(uVar27 | 7) < (int)_h; uVar27 = uVar27 + 8) {
          local_1a8 = CONCAT44(local_1a8._4_4_,uVar27);
          lVar37 = lVar38;
          for (uVar25 = 0; uVar25 != uVar46; uVar25 = uVar25 + 1) {
            lVar43 = lVar37;
            for (lVar35 = 0; (int)lVar35 != 0x20; lVar35 = lVar35 + 8) {
              puVar41[lVar35] = *(undefined1 *)((long)pvVar30 + lVar43 + iVar36);
              puVar41[lVar35 + 1] = *(undefined1 *)(lVar44 + lVar43);
              puVar41[lVar35 + 2] = *(undefined1 *)((long)pvVar30 + lVar43 + (int)uVar31);
              puVar41[lVar35 + 3] = *(undefined1 *)(lVar32 + lVar43);
              puVar41[lVar35 + 4] = *(undefined1 *)((long)pvVar30 + lVar43 + iVar33);
              puVar41[lVar35 + 5] = *(undefined1 *)(lVar20 + lVar43);
              puVar41[lVar35 + 6] = *(undefined1 *)((long)pvVar30 + lVar43 + local_68);
              puVar41[lVar35 + 7] = *(undefined1 *)(lVar42 + lVar43);
              lVar43 = lVar43 + lVar28;
            }
            lVar37 = lVar37 + 1;
            puVar41 = puVar41 + lVar35;
          }
          local_138 = local_138 + (long)local_190;
          local_c0 = local_c0 + (long)local_190;
          local_c8 = local_c8 + (long)local_190;
          local_1e8 = local_1e8 + (long)local_190;
          lVar38 = lVar38 + (long)local_190;
          local_1c8 = local_1c8 + (long)local_190;
          local_1d0 = local_1d0 + (long)local_190;
          local_1c0 = local_1c0 + (long)local_190;
          local_1b8 = local_1b8 + (long)local_190;
        }
        for (; (int)(uVar27 | 1) < (int)_h; uVar27 = uVar27 + 2) {
          puVar19 = puVar41;
          for (uVar25 = 0; uVar46 != uVar25; uVar25 = uVar25 + 1) {
            puVar41[uVar25 * 8] = *(undefined1 *)(local_138 + uVar25);
            puVar41[uVar25 * 8 + 1] = *(undefined1 *)(local_1b8 + uVar25);
            puVar41[uVar25 * 8 + 2] = *(undefined1 *)(local_c0 + uVar25);
            puVar41[uVar25 * 8 + 3] = *(undefined1 *)(local_1c0 + uVar25);
            puVar41[uVar25 * 8 + 4] = *(undefined1 *)(local_c8 + uVar25);
            puVar41[uVar25 * 8 + 5] = *(undefined1 *)(local_1d0 + uVar25);
            puVar41[uVar25 * 8 + 6] = *(undefined1 *)(local_1e8 + uVar25);
            puVar41[uVar25 * 8 + 7] = *(undefined1 *)(local_1c8 + uVar25);
            puVar19 = puVar19 + 8;
          }
          local_138 = local_138 + lVar28;
          local_c0 = local_c0 + lVar28;
          local_c8 = local_c8 + lVar28;
          local_1e8 = local_1e8 + lVar28;
          local_1c8 = local_1c8 + lVar28;
          local_1d0 = local_1d0 + lVar28;
          local_1c0 = local_1c0 + lVar28;
          local_1b8 = local_1b8 + lVar28;
          puVar41 = puVar19;
        }
        for (; (int)uVar27 < (int)_h; uVar27 = uVar27 + 1) {
          for (uVar25 = 0; uVar46 != uVar25; uVar25 = uVar25 + 1) {
            *puVar41 = *(undefined1 *)(local_138 + uVar25);
            puVar41[1] = *(undefined1 *)(local_c0 + uVar25);
            puVar41[2] = *(undefined1 *)(local_c8 + uVar25);
            puVar41[3] = *(undefined1 *)(local_1e8 + uVar25);
            puVar41 = puVar41 + 4;
          }
        }
        local_e0 = (ulong)(iVar36 + uVar15);
        iVar22 = iVar22 + uVar15;
        iVar33 = iVar33 + uVar15;
        opt = local_1a0;
        uVar27 = uVar31 + uVar15;
        local_184 = uVar31;
        local_50 = uVar18;
        uVar25 = uVar18 + 4;
      }
      local_198 = (ulong)(int)(uVar21 * 3);
      local_c0 = (long)(int)(uVar21 * 5);
      local_c8 = (long)(int)(uVar21 * 6);
      local_60 = (long)(int)(uVar21 * 7);
      iVar22 = uVar21 * _h * 2;
      local_68 = CONCAT44(local_68._4_4_,iVar22);
      while (uVar27 = uVar31, uVar17 = uVar18, uVar25 = local_e0, (long)(uVar17 | 1) < (long)uVar24)
      {
        pvVar30 = (this->super_Convolution).weight_data.data;
        lVar20 = (long)(int)(uVar23 * (uint)uVar17) + (long)pvVar30;
        lVar45 = (long)(int)((int)(uVar17 | 1) * uVar23) + (long)pvVar30;
        lVar32 = (long)(int)uVar27;
        local_1e8 = (long)pvVar30 + lVar32 + local_60;
        local_1b8 = (long)pvVar30 + lVar32 + local_c8;
        local_1c0 = (long)pvVar30 + lVar32 + local_c0;
        local_1d0 = (long)pvVar30 + lVar32 + (int)(uVar21 * 4);
        local_1c8 = (long)pvVar30 + lVar32 + local_198;
        lVar42 = (long)pvVar30 + lVar32 + lVar28;
        lVar38 = (long)pvVar30 + lVar32 + local_40;
        lVar32 = (long)(int)local_e0;
        lVar43 = (long)pvVar30 + lVar32 + local_60;
        lVar47 = (long)pvVar30 + lVar32 + local_c8;
        lVar48 = (long)pvVar30 + lVar32 + local_c0;
        lVar44 = (long)pvVar30 + lVar32 + (int)(uVar21 * 4);
        lVar35 = (long)pvVar30 + lVar32 + local_198;
        lVar37 = (long)pvVar30 + lVar32 + lVar28;
        lVar32 = (long)pvVar30 + lVar32 + local_40;
        puVar41 = (undefined1 *)
                  ((ulong)(((uint)(uVar17 >> 2) & 0x3fffffff) + (uint)(((uint)uVar17 >> 1 & 1) != 0)
                          ) * (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize +
                  (long)(this->weight_data_tm).data);
        uVar15 = 0;
        while( true ) {
          local_1a8 = CONCAT44(local_1a8._4_4_,uVar15);
          if ((int)_h <= (int)(uVar15 | 7)) break;
          for (uVar25 = 0; uVar46 != uVar25; uVar25 = uVar25 + 1) {
            *puVar41 = *(undefined1 *)(lVar20 + uVar25);
            puVar41[1] = *(undefined1 *)(lVar32 + uVar25);
            puVar41[2] = *(undefined1 *)(lVar37 + uVar25);
            puVar41[3] = *(undefined1 *)(lVar35 + uVar25);
            puVar41[4] = *(undefined1 *)(lVar44 + uVar25);
            puVar41[5] = *(undefined1 *)(lVar48 + uVar25);
            puVar41[6] = *(undefined1 *)(lVar47 + uVar25);
            puVar41[7] = *(undefined1 *)(lVar43 + uVar25);
            puVar41[8] = *(undefined1 *)(lVar45 + uVar25);
            puVar41[9] = *(undefined1 *)(lVar38 + uVar25);
            puVar41[10] = *(undefined1 *)(lVar42 + uVar25);
            puVar41[0xb] = *(undefined1 *)(local_1c8 + uVar25);
            puVar41[0xc] = *(undefined1 *)(local_1d0 + uVar25);
            puVar41[0xd] = *(undefined1 *)(local_1c0 + uVar25);
            puVar41[0xe] = *(undefined1 *)(local_1b8 + uVar25);
            puVar41[0xf] = *(undefined1 *)(local_1e8 + uVar25);
            puVar41 = puVar41 + 0x10;
          }
          lVar20 = lVar20 + (long)local_190;
          lVar45 = lVar45 + (long)local_190;
          uVar15 = uVar15 + 8;
          local_1e8 = local_1e8 + (long)local_190;
          local_1b8 = local_1b8 + (long)local_190;
          local_1c0 = local_1c0 + (long)local_190;
          local_1d0 = local_1d0 + (long)local_190;
          local_1c8 = local_1c8 + (long)local_190;
          lVar42 = lVar42 + (long)local_190;
          lVar38 = lVar38 + (long)local_190;
          lVar43 = lVar43 + (long)local_190;
          lVar47 = lVar47 + (long)local_190;
          lVar48 = lVar48 + (long)local_190;
          lVar44 = lVar44 + (long)local_190;
          lVar35 = lVar35 + (long)local_190;
          lVar37 = lVar37 + (long)local_190;
          lVar32 = lVar32 + (long)local_190;
        }
        for (; (int)(uVar15 | 1) < (int)_h; uVar15 = uVar15 + 2) {
          puVar19 = puVar41;
          for (uVar25 = 0; uVar46 != uVar25; uVar25 = uVar25 + 1) {
            puVar41[uVar25 * 4] = *(undefined1 *)(lVar20 + uVar25);
            puVar41[uVar25 * 4 + 1] = *(undefined1 *)(lVar45 + uVar25);
            puVar41[uVar25 * 4 + 2] = *(undefined1 *)(lVar32 + uVar25);
            puVar41[uVar25 * 4 + 3] = *(undefined1 *)(lVar38 + uVar25);
            puVar19 = puVar19 + 4;
          }
          lVar20 = lVar20 + lVar28;
          lVar45 = lVar45 + lVar28;
          lVar38 = lVar38 + lVar28;
          lVar32 = lVar32 + lVar28;
          puVar41 = puVar19;
        }
        for (; (int)uVar15 < (int)_h; uVar15 = uVar15 + 1) {
          for (uVar25 = 0; uVar46 != uVar25; uVar25 = uVar25 + 1) {
            *puVar41 = *(undefined1 *)(lVar20 + uVar25);
            puVar41[1] = *(undefined1 *)(lVar45 + uVar25);
            puVar41 = puVar41 + 2;
          }
        }
        local_e0 = (ulong)(uint)((int)local_e0 + iVar22);
        opt = local_1a0;
        uVar31 = uVar27 + iVar22;
        local_184 = uVar27;
        local_50 = uVar17;
        uVar18 = uVar17 + 2;
      }
      for (; (long)uVar17 < (long)uVar24; uVar17 = uVar17 + 1) {
        pvVar30 = (this->super_Convolution).weight_data.data;
        uVar27 = (uint)uVar17;
        lVar42 = (long)(int)(uVar23 * uVar27) + (long)pvVar30;
        puVar41 = (undefined1 *)
                  ((ulong)((uVar27 & 1) + ((uint)(uVar17 >> 2) & 0x3fffffff) +
                          (uint)((uVar27 >> 1 & 1) != 0)) * (this->weight_data_tm).cstep *
                   (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        lVar20 = (int)uVar25 + local_40 + (long)pvVar30;
        for (uVar27 = 0; (int)(uVar27 | 7) < (int)_h; uVar27 = uVar27 + 8) {
          for (uVar18 = 0; uVar18 != uVar46; uVar18 = uVar18 + 1) {
            puVar19 = (undefined1 *)(lVar42 + uVar18);
            for (lVar32 = 0; (int)lVar32 != 8; lVar32 = lVar32 + 1) {
              puVar41[lVar32] = *puVar19;
              puVar19 = puVar19 + local_40;
            }
            puVar41 = puVar41 + lVar32;
          }
          lVar42 = lVar42 + (long)local_190;
          lVar20 = lVar20 + (long)local_190;
        }
        for (; (int)(uVar27 | 1) < (int)_h; uVar27 = uVar27 + 2) {
          for (uVar18 = 0; uVar46 != uVar18; uVar18 = uVar18 + 1) {
            *puVar41 = *(undefined1 *)(lVar42 + uVar18);
            puVar41[1] = *(undefined1 *)(lVar20 + uVar18);
            puVar41 = puVar41 + 2;
          }
          lVar42 = lVar42 + lVar28;
          lVar20 = lVar20 + lVar28;
        }
        for (; (int)uVar27 < (int)_h; uVar27 = uVar27 + 1) {
          for (uVar18 = 0; uVar46 != uVar18; uVar18 = uVar18 + 1) {
            puVar41[uVar18] = *(undefined1 *)(lVar42 + uVar18);
          }
          puVar41 = puVar41 + uVar18;
        }
        uVar25 = (ulong)((int)uVar25 + uVar21 * _h);
      }
      goto LAB_0014ed75;
    }
    iVar33 = _h * uVar21;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8
              (uVar23,0,iVar33,&TILE_M_2,&TILE_M,&TILE_N,opt->num_threads);
    iVar22 = (int)(TILE_M_2 + uVar23 + -1) / TILE_M_2;
    uVar27 = 8;
    if (local_1a0->use_packing_layout == false) {
      uVar27 = 1;
    }
    if ((uVar46 & 7) != 0) {
      uVar27 = 1;
    }
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    if (uVar21 == 1) {
      Mat::reshape(&m,local_d8,iVar33,uVar23,(Allocator *)0x0);
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + 1;
        UNLOCK();
      }
      piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (local_128.allocator == (Allocator *)0x0) {
            free(local_128.data);
          }
          else {
            (*(local_128.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      local_128.data = m.data;
      local_128.refcount._0_4_ = SUB84(m.refcount,0);
      local_128.refcount._4_4_ = (undefined4)((ulong)m.refcount >> 0x20);
      local_128.elemsize._0_4_ = (undefined4)m.elemsize;
      local_128.elemsize._4_4_ = (undefined4)(m.elemsize >> 0x20);
      local_128.elempack = m.elempack;
      local_128.allocator = m.allocator;
      local_128.dims = m.dims;
      local_128.w = m.w;
      local_128.h = m.h;
      local_128.d = m.d;
      local_128.c = m.c;
      local_128.cstep = m.cstep;
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) {
LAB_0014eadd:
            free(m.data);
          }
          else {
            (*(m.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::reshape(&m,local_d8,uVar21,_h,uVar23,(Allocator *)0x0);
      uVar24 = 0;
      Mat::create(&local_128,iVar33,uVar23,1,1,(Allocator *)0x0);
      uVar46 = (ulong)uVar21;
      if ((int)uVar21 < 1) {
        uVar46 = uVar24;
      }
      uVar25 = 0;
      if (0 < (int)uVar23) {
        uVar25 = (ulong)uVar23;
      }
      for (; uVar24 != uVar25; uVar24 = uVar24 + 1) {
        pvVar30 = (void *)((long)local_128.w * uVar24 *
                           CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize) +
                          (long)local_128.data);
        for (lVar42 = 0; lVar42 < (long)(lVar28 - (ulong)(uVar27 - 1));
            lVar42 = lVar42 + (ulong)uVar27) {
          for (uVar18 = 0; uVar18 != uVar46; uVar18 = uVar18 + 1) {
            for (uVar17 = 0; uVar27 != uVar17; uVar17 = uVar17 + 1) {
              *(undefined1 *)((long)pvVar30 + uVar17) =
                   *(undefined1 *)
                    ((long)m.data +
                    uVar18 + (lVar42 + uVar17) * (long)m.w * m.elemsize +
                             m.cstep * uVar24 * m.elemsize);
            }
            pvVar30 = (void *)((long)pvVar30 + uVar17);
          }
        }
      }
      if (m.refcount != (int *)0x0) {
        LOCK();
        *m.refcount = *m.refcount + -1;
        UNLOCK();
        if (*m.refcount == 0) {
          if (m.allocator == (Allocator *)0x0) goto LAB_0014eadd;
          (*(m.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar36 = TILE_N;
    if (TILE_N < 4) {
LAB_0014eb3f:
      Mat::create(&this->weight_sgemm_data,TILE_M_2 * iVar36,(iVar33 + iVar36 + -1) / iVar36,
                  (int)((uVar23 - 1) + TILE_M_2) / TILE_M_2,1,1,(Allocator *)0x0);
    }
    else {
      iVar16 = cpu_support_x86_avx512_vnni();
      bVar14 = true;
      if (iVar16 == 0) {
        iVar16 = cpu_support_x86_avx_vnni();
        bVar14 = iVar16 != 0;
      }
      iVar16 = cpu_support_x86_avx_vnni_int8();
      if (!(bool)(bVar14 & iVar16 == 0)) goto LAB_0014eb3f;
      if (TILE_M_2 < 0x10) {
        if (TILE_M_2 < 8) {
          if (TILE_M_2 < 4) {
            iVar16 = (uint)(1 < TILE_M_2) * 4 + 4;
          }
          else {
            iVar16 = 0x10;
          }
        }
        else {
          iVar16 = 0x20;
        }
      }
      else {
        iVar16 = 0x40;
      }
      Mat::create(&this->weight_sgemm_data,(iVar16 + iVar36) * TILE_M_2,
                  (iVar33 + iVar36 + -1) / iVar36,(int)((uVar23 - 1) + TILE_M_2) / TILE_M_2,1,1,
                  (Allocator *)0x0);
    }
    iVar16 = 0;
    if (iVar22 < 1) {
      iVar22 = 0;
    }
    for (; opt = local_1a0, iVar16 != iVar22; iVar16 = iVar16 + 1) {
      i_00 = TILE_M_2 * iVar16;
      max_ii = uVar23 - i_00;
      if (TILE_M_2 < (int)(uVar23 - i_00)) {
        max_ii = TILE_M_2;
      }
      for (k_00 = 0; max_kk = iVar33 - k_00, max_kk != 0 && k_00 <= iVar33; k_00 = k_00 + TILE_N) {
        if (iVar36 < max_kk) {
          max_kk = iVar36;
        }
        m.elemsize = (this->weight_sgemm_data).elemsize;
        m.w = (this->weight_sgemm_data).w;
        m.cstep = (size_t)m.w;
        m.elempack = (this->weight_sgemm_data).elempack;
        m.allocator = (this->weight_sgemm_data).allocator;
        m.data = (void *)((long)(this->weight_sgemm_data).data +
                         m.elemsize * m.cstep * (long)(k_00 / iVar36) +
                         (long)(i_00 / TILE_M_2) * (this->weight_sgemm_data).cstep * m.elemsize);
        m.refcount = (int *)0x0;
        m.dims = 2;
        m.h = 1;
        m.d = 1;
        m.c = 1;
        Gemm_x86_utility::pack_A_tile_int8(&local_128,&m,i_00,max_ii,k_00,max_kk);
        if (m.refcount != (int *)0x0) {
          LOCK();
          *m.refcount = *m.refcount + -1;
          UNLOCK();
          if (*m.refcount == 0) {
            if (m.allocator == (Allocator *)0x0) {
              free(m.data);
            }
            else {
              (*(m.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        iVar36 = TILE_N;
      }
    }
    piVar11 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar11 == (int *)0x0) goto LAB_0014ed75;
    LOCK();
    *piVar11 = *piVar11 + -1;
    UNLOCK();
    if (*piVar11 != 0) goto LAB_0014ed75;
    if (local_128.allocator != (Allocator *)0x0) {
      (*(local_128.allocator)->_vptr_Allocator[3])();
      goto LAB_0014ed75;
    }
  }
  free(local_128.data);
LAB_0014ed75:
  uVar46 = 0;
  Mat::create(&this->scale_in_data,(this->super_Convolution).num_output,4,(Allocator *)0x0);
  uVar23 = (this->super_Convolution).num_output;
  pvVar30 = (this->super_Convolution).weight_data_int8_scales.data;
  pfVar9 = (float *)(this->super_Convolution).bottom_blob_int8_scales.data;
  pvVar10 = (this->scale_in_data).data;
  uVar24 = 0;
  if (0 < (int)uVar23) {
    uVar24 = (ulong)uVar23;
  }
  for (; uVar24 != uVar46; uVar46 = uVar46 + 1) {
    fVar1 = *(float *)((long)pvVar30 + uVar46 * 4);
    fVar50 = 0.0;
    if (fVar1 != 0.0) {
      fVar50 = 1.0 / (fVar1 * *pfVar9);
    }
    *(float *)((long)pvVar10 + uVar46 * 4) = fVar50;
  }
  if (opt->lightmode != false) {
    piVar11 = (this->super_Convolution).weight_data.refcount;
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        pAVar12 = (this->super_Convolution).weight_data.allocator;
        if (pAVar12 == (Allocator *)0x0) {
          free((this->super_Convolution).weight_data.data);
        }
        else {
          (*pAVar12->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_Convolution).weight_data.cstep = 0;
    *(undefined8 *)((long)&local_d8->refcount + 4) = 0;
    *(undefined8 *)((long)&local_d8->elemsize + 4) = 0;
    local_d8->data = (void *)0x0;
    local_d8->refcount = (int *)0x0;
    (this->super_Convolution).weight_data.dims = 0;
    (this->super_Convolution).weight_data.w = 0;
    (this->super_Convolution).weight_data.h = 0;
    (this->super_Convolution).weight_data.d = 0;
    (this->super_Convolution).weight_data.c = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86::create_pipeline_int8_x86(const Option& opt)
{
    const int maxk = kernel_w * kernel_h;
    const int num_input = weight_data_size / maxk / num_output;

    bool prefer_winograd = (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && (num_input > 8 || num_output > 8);

    if (opt.use_winograd_convolution && prefer_winograd && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
    {
        if (opt.use_winograd43_convolution)
            conv3x3s1_winograd43_transform_kernel_int8(weight_data, weight_winograd43_data, num_input, num_output, opt);
        else
            conv3x3s1_winograd23_transform_kernel_int8(weight_data, weight_winograd23_data, num_input, num_output, opt);
    }
    else if (opt.use_sgemm_convolution)
    {
        convolution_im2col_gemm_transform_kernel_int8(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h, opt);
    }
    else
    {
        convolution_transform_kernel_packed_int8(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h);
    }

    scale_in_data.create(num_output);
    for (int p = 0; p < num_output; p++)
    {
        // requantize and relu
        float scale_in;
        if (weight_data_int8_scales[p] == 0)
            scale_in = 0;
        else
            scale_in = 1.f / (bottom_blob_int8_scales[0] * weight_data_int8_scales[p]);

        scale_in_data[p] = scale_in;
    }

    if (opt.lightmode)
        weight_data.release();

    return 0;
}